

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_upload.c
# Opt level: O2

Qiniu_Error
upload_one_part(Qiniu_Client *client,Qiniu_Multipart_PutExtra *extraParam,char *path,int partNum,
               Qiniu_ReaderAt reader,Qiniu_Int64 partOffset,Qiniu_Int64 partSize,char *md5str,
               Qiniu_UploadPartResp *ret,_Qiniu_Progress_Callback_Data *progressCallback)

{
  Qiniu_ReaderAt r;
  uint code;
  Qiniu_Retry_Decision QVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  Qiniu_Reader body;
  Qiniu_Error QVar7;
  Qiniu_Error QVar8;
  Qiniu_Json *callRet;
  Qiniu_Multipart_PutExtra *local_98;
  size_t local_90;
  _func_int_void_ptr_double_double_double_double *local_88;
  Qiniu_Multipart_PutExtra *local_80;
  _Qiniu_Progress_Callback_Data *local_78;
  char *local_70;
  void *local_68;
  Qiniu_FnReadAt local_60;
  Qiniu_Section section;
  
  local_60 = reader.ReadAt;
  local_68 = reader.self;
  if (progressCallback == (_Qiniu_Progress_Callback_Data *)0x0) {
    progressCallback = (_Qiniu_Progress_Callback_Data *)0x0;
    local_88 = (_func_int_void_ptr_double_double_double_double *)0x0;
  }
  else {
    bVar6 = progressCallback->callback == (_func_void_size_t_size_t *)0x0;
    if (bVar6) {
      progressCallback = (_Qiniu_Progress_Callback_Data *)0x0;
    }
    local_88 = _Qiniu_Progress_Callback;
    if (bVar6) {
      local_88 = (_func_int_void_ptr_double_double_double_double *)0x0;
    }
  }
  if (extraParam->upHost == (char *)0x0) {
    local_98 = (Qiniu_Multipart_PutExtra *)extraParam->upHosts;
    local_90 = extraParam->upHostsCount;
  }
  else {
    local_90 = 1;
    local_98 = extraParam;
  }
  uVar5 = 0;
  pcVar4 = Qiniu_OK.message;
  code = Qiniu_OK.code;
  local_80 = extraParam;
  local_78 = progressCallback;
  local_70 = path;
  do {
    if (((long)local_80->tryTimes <= (long)uVar5) || (client->hostsRetriesMax < uVar5)) {
      if (code == 200) {
LAB_00120c04:
        code = 200;
        if (local_80->notify != (NotifyFunc)0x0) {
          (*local_80->notify)(ret);
        }
        goto LAB_00120c1d;
      }
      break;
    }
    section.off = 0;
    section.limit = 0;
    section.r.self = (void *)0x0;
    section.r.ReadAt = (Qiniu_FnReadAt)0x0;
    r.ReadAt = local_60;
    r.self = local_68;
    body = Qiniu_SectionReader(&section,r,partOffset,partSize);
    callRet = (Qiniu_Json *)0x0;
    pcVar2 = Qiniu_String_Concat((&local_98->upHost)[uVar5 % local_90],local_70,0);
    QVar7 = Qiniu_Client_CallWithMethodAndProgressCallback
                      (client,&callRet,pcVar2,body,partSize,(char *)0x0,"PUT",md5str,local_88,
                       local_78);
    pcVar4 = QVar7.message;
    code = QVar7.code;
    Qiniu_Free(pcVar2);
    if (code == 200) {
      if (ret != (Qiniu_UploadPartResp *)0x0) {
        pcVar2 = Qiniu_Json_GetString(callRet,"md5",(char *)0x0);
        pcVar3 = Qiniu_Json_GetString(callRet,"etag",(char *)0x0);
        pcVar3 = Qiniu_String_Dup(pcVar3);
        ret->etag = pcVar3;
        pcVar2 = Qiniu_String_Dup(pcVar2);
        ret->md5 = pcVar2;
        ret->partNum = partNum;
      }
      goto LAB_00120c04;
    }
    QVar1 = _Qiniu_Should_Retry(code);
    uVar5 = uVar5 + 1;
  } while (QVar1 != QINIU_DONT_RETRY);
  if (local_80->notifyErr != (NotifyErrFunc)0x0) {
    QVar7._4_4_ = 0;
    QVar7.code = code;
    QVar7.message = pcVar4;
    (*local_80->notifyErr)(partNum,QVar7);
  }
LAB_00120c1d:
  QVar8._4_4_ = 0;
  QVar8.code = code;
  QVar8.message = pcVar4;
  return QVar8;
}

Assistant:

Qiniu_Error upload_one_part(Qiniu_Client *client, Qiniu_Multipart_PutExtra *extraParam, const char *path,
                            int partNum, Qiniu_ReaderAt reader, Qiniu_Int64 partOffset, Qiniu_Int64 partSize, const char *md5str,
                            Qiniu_UploadPartResp *ret, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Error err = Qiniu_OK;
    const char *const *upHosts;
    size_t upHostsCount;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    if (extraParam->upHost != NULL)
    {
        upHosts = &extraParam->upHost;
        upHostsCount = 1;
    }
    else
    {
        upHosts = extraParam->upHosts;
        upHostsCount = extraParam->upHostsCount;
    }
    for (int tries = 0; tries < extraParam->tryTimes && tries <= client->hostsRetriesMax; tries++)
    {
        Qiniu_Section section;
        Qiniu_Zero(section);
        Qiniu_Reader thisPartBody = Qiniu_SectionReader(&section, reader, (Qiniu_Off_T)partOffset, partSize);
        Qiniu_Json *callRet = NULL; // don't cJSON_Delete(callRet), it will be automatically freed on next http request by Qiniu_Client_Call.
        const char *upHost = upHosts[tries % upHostsCount];
        const char *reqUrl = Qiniu_String_Concat(upHost, path, NULL);
        err = Qiniu_Client_CallWithMethodAndProgressCallback(client, &callRet, reqUrl, thisPartBody, partSize, NULL, "PUT", md5str, callback, callbackData);
        Qiniu_Free((void *)reqUrl);
        if (err.code == 200)
        {
            if (ret != NULL)
            {
                const char *md5 = Qiniu_Json_GetString(callRet, "md5", NULL);
                const char *etag = Qiniu_Json_GetString(callRet, "etag", NULL);
                ret->etag = Qiniu_String_Dup(etag);
                ret->md5 = Qiniu_String_Dup(md5);
                ret->partNum = partNum;
            }
            break;
        }
        else if (_Qiniu_Should_Retry(err.code) == QINIU_DONT_RETRY)
        {
            break;
        }
    }
    // notify callback
    if (err.code == 200 && extraParam->notify)
    {
        extraParam->notify(ret);
    }
    else if (err.code != 200 && extraParam->notifyErr)
    {
        extraParam->notifyErr(partNum, err);
    }

    return err;
}